

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

boolean swamp_effects(void)

{
  boolean bVar1;
  int iVar2;
  uint uVar3;
  
  if (((u.uprops[0x27].extrinsic != 0) &&
      (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0')) ||
     ((uarmf != (obj *)0x0 &&
      ((obj_descr[objects[uarmf->otyp].oc_descr_idx].oc_descr != (char *)0x0 &&
       (iVar2 = strncmp(obj_descr[objects[uarmf->otyp].oc_descr_idx].oc_descr,"mud ",4), iVar2 == 0)
       ))))) goto LAB_0026bc54;
  if (u.utraptype != 5) {
    if ((u.uprops[0x39].extrinsic == 0 && u.uprops[0x39].intrinsic == 0) &&
       (((youmonst.data)->mflags1 & 2) == 0)) {
      if (u.usteed == (monst *)0x0) {
        if (u.uprops[0x31].intrinsic == 0) goto LAB_0026bbda;
      }
      else if (((u.usteed)->data->mflags1 & 2) == 0 && u.uprops[0x31].intrinsic == 0) {
LAB_0026bbda:
        if (((youmonst.data)->mflags1 & 0x600) == 0 && u.uprops[0x31].extrinsic == 0) {
          uVar3 = mt_random();
          u.utrap = uVar3 % 3 + 1;
          u.utraptype = 5;
          pline("You step into the muddy swamp.");
          goto LAB_0026bbfa;
        }
      }
    }
    Norep("You swim in the muddy water.");
  }
LAB_0026bbfa:
  uVar3 = mt_random();
  if (uVar3 * -0x33333333 < 0x33333334) {
    water_damage(invent,'\0','\0');
    pline("Your baggage gets wet.");
  }
  else if (uarmf != (obj *)0x0) {
    rust_dmg(uarmf,"boots",1,'\x01',&youmonst);
  }
LAB_0026bc54:
  if ((u.umonnum == 0x29) && (uVar3 = mt_random(), 0x55555555 < uVar3 * -0x55555555)) {
    split_mon(&youmonst,(monst *)0x0);
  }
  else if (u.umonnum == 0x10a) {
    uVar3 = mt_random();
    iVar2 = uVar3 % 6 + 1;
    pline("You rust!");
    if (u.mhmax - iVar2 != 0 && iVar2 <= u.mhmax) {
      u.mhmax = u.mhmax - iVar2;
    }
    losehp(iVar2,"rusting away",1);
  }
  return '\0';
}

Assistant:

boolean swamp_effects(void)
{
	boolean swampok = FALSE;

	if (Wwalking) {
	    swampok = TRUE;
	} else if (uarmf) {
	    const char *desc = OBJ_DESCR(objects[uarmf->otyp]);
	    if (desc && !strncmp(desc, "mud ", 4))
		swampok = TRUE;
	}

	if (!swampok) {
	    if (u.utraptype != TT_SWAMP) {
		if (!Swimming && !Amphibious) {
		    u.utrap = rnd(3);
		    u.utraptype = TT_SWAMP;
		    pline("You step into the muddy swamp.");
		} else {
		    Norep("You swim in the muddy water.");
		}
	    }
	    if (!rn2(5)) {
		water_damage(invent, FALSE, FALSE);
		pline("Your baggage gets wet.");
	    } else if (uarmf) {
		rust_dmg(uarmf, "boots", 1, TRUE, &youmonst);
	    }
	}

	if (u.umonnum == PM_GREMLIN && rn2(3)) {
	    split_mon(&youmonst, NULL);
	} else if (u.umonnum == PM_IRON_GOLEM) {
	    int damage = rnd(6);
	    pline("You rust!");
	    if (u.mhmax > damage) u.mhmax -= damage;
	    losehp(damage, "rusting away", KILLED_BY);
	}

	return FALSE;
}